

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O3

void __thiscall JSONNode::merge(JSONNode *this,JSONNode *other)

{
  internalJSONNode *ptr;
  size_t sVar1;
  internalJSONNode *ptr_00;
  
  ptr_00 = this->internal;
  ptr = other->internal;
  if (ptr_00 != ptr) {
    if (ptr_00->refcount < ptr->refcount) {
      sVar1 = ptr_00->refcount - 1;
      ptr_00->refcount = sVar1;
      if (sVar1 == 0) {
        internalJSONNode::deleteInternal(ptr_00);
        ptr = other->internal;
      }
      ptr->refcount = ptr->refcount + 1;
      this->internal = ptr;
    }
    else {
      sVar1 = ptr->refcount - 1;
      ptr->refcount = sVar1;
      if (sVar1 == 0) {
        internalJSONNode::deleteInternal(ptr);
        ptr_00 = this->internal;
      }
      ptr_00->refcount = ptr_00->refcount + 1;
      other->internal = ptr_00;
    }
  }
  return;
}

Assistant:

void JSONNode::merge(JSONNode &) json_nothrow {
#endif
    JSON_CHECK_INTERNAL();
    #ifdef JSON_REF_COUNT
	   if (internal == other.internal) return;
	   JSON_ASSERT(*this == other, JSON_TEXT("merging two nodes that aren't equal"));
	   if (internal -> refcount < other.internal -> refcount){
		  *this = other;
	   } else {
		  other = *this;
	   }
    #endif
}